

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O2

Gia_Man_t *
Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  Gia_Obj_t *pGVar1;
  Vec_Bit_t *pVVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  ulong uVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  int Entry;
  int Entry_00;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int v;
  ulong local_48;
  
  Gia_ManCleanMark0(p);
  local_48 = 0;
  do {
    iVar12 = p->nRegs;
    iVar7 = (int)local_48;
    if (iVar12 <= iVar7) {
LAB_00454c99:
      pVVar2 = Vec_BitStart(iVar12);
      *pvInits = pVVar2;
      iVar7 = 0;
      iVar12 = 0;
      if (0 < iFrEnd) {
        iVar12 = iFrEnd;
      }
      for (; iVar7 != iVar12; iVar7 = iVar7 + 1) {
        if (iVar7 == iFrBeg) {
          iVar10 = 0;
          while ((iVar10 < p->nRegs &&
                 (pGVar1 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar10),
                 pGVar1 != (Gia_Obj_t *)0x0))) {
            if ((pGVar1->field_0x3 & 0x40) != 0) {
              Vec_BitWriteEntry(*pvInits,iVar10,Entry);
            }
            iVar10 = iVar10 + 1;
          }
        }
        iVar10 = 0;
        while( true ) {
          uVar11 = (int)local_48 + iVar10;
          if ((p->vCis->nSize - p->nRegs <= iVar10) ||
             (pGVar1 = Gia_ManCi(p,iVar10), pGVar1 == (Gia_Obj_t *)0x0)) break;
          *(ulong *)pGVar1 =
               *(ulong *)pGVar1 & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)uVar11 >> 5] >> ((byte)uVar11 & 0x1f) & 1) << 0x1e
                      );
          iVar10 = iVar10 + 1;
        }
        iVar10 = 0;
        while ((iVar10 < p->nObjs && (pGVar1 = Gia_ManObj(p,iVar10), pGVar1 != (Gia_Obj_t *)0x0))) {
          uVar9 = *(ulong *)pGVar1;
          if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
            uVar15 = (uint)(uVar9 >> 0x20);
            *(ulong *)pGVar1 =
                 uVar9 & 0xffffffff3fffffff |
                 (ulong)(((uVar15 >> 0x1d ^
                          *(uint *)(pGVar1 + -(ulong)(uVar15 & 0x1fffffff)) >> 0x1e) &
                          ((uint)(uVar9 >> 0x1d) & 7 ^
                          *(uint *)(pGVar1 + -(uVar9 & 0x1fffffff)) >> 0x1e) & 1) << 0x1e);
          }
          iVar10 = iVar10 + 1;
        }
        iVar10 = 0;
        while ((iVar10 < p->vCos->nSize &&
               (pGVar1 = Gia_ManCo(p,iVar10), pGVar1 != (Gia_Obj_t *)0x0))) {
          uVar15 = (uint)*(ulong *)pGVar1;
          *(ulong *)pGVar1 =
               *(ulong *)pGVar1 & 0xffffffffbfffffff |
               (ulong)((uVar15 * 2 ^ *(uint *)(pGVar1 + -(ulong)(uVar15 & 0x1fffffff))) & 0x40000000
                      );
          iVar10 = iVar10 + 1;
        }
        iVar10 = 0;
        while (((iVar10 < p->nRegs &&
                (pGVar1 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar10),
                pGVar1 != (Gia_Obj_t *)0x0)) &&
               (pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar10),
               pGVar3 != (Gia_Obj_t *)0x0))) {
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)pGVar1 & 0x40000000);
          iVar10 = iVar10 + 1;
        }
        local_48 = (ulong)uVar11;
      }
      if (iFrEnd < 0) {
        __assert_fail("i == iFrEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                      ,0x10b,
                      "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                     );
      }
      pVVar2 = Vec_BitStart(p->nRegs);
      iVar12 = 0;
      while ((iVar12 < p->nRegs &&
             (pGVar1 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12), pGVar1 != (Gia_Obj_t *)0x0
             ))) {
        if ((pGVar1->field_0x3 & 0x40) != 0) {
          Vec_BitWriteEntry(pVVar2,iVar12,Entry_00);
        }
        iVar12 = iVar12 + 1;
      }
      p_00 = Gia_ManStart(10000);
      pcVar4 = Abc_UtilStrsav(p->pName);
      p_00->pName = pcVar4;
      iVar12 = 0;
      while ((iVar12 < p->nRegs &&
             (pGVar1 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12), pGVar1 != (Gia_Obj_t *)0x0
             ))) {
        Gia_ManAppendCi(p_00);
        iVar12 = iVar12 + 1;
      }
      Gia_ManHashStart(p_00);
      p->pObjs->Value = 1;
      iVar12 = 0;
      while ((iVar7 = iFrEnd, iVar12 < p->vCis->nSize - p->nRegs &&
             (pGVar1 = Gia_ManCi(p,iVar12), pGVar1 != (Gia_Obj_t *)0x0))) {
        pGVar1->Value = 1;
        iVar12 = iVar12 + 1;
      }
      do {
        if (pCex->iFrame < iVar7) {
          Gia_ManHashStop(p_00);
          Vec_BitFree(pVVar2);
          pGVar6 = Gia_ManCleanup(p_00);
          Gia_ManStop(p_00);
          return pGVar6;
        }
        iVar12 = 0;
        while ((uVar9 = local_48, iVar10 = iFrEnd, iVar12 < p->nRegs &&
               (pGVar1 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12),
               pGVar1 != (Gia_Obj_t *)0x0))) {
          iVar10 = Vec_BitEntry(pVVar2,iVar12);
          *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xffffffffbfffffff | (ulong)(uint)(iVar10 << 0x1e);
          iVar12 = iVar12 + 1;
        }
        for (; iVar10 < iVar7; iVar10 = iVar10 + 1) {
          iVar12 = 0;
          while ((uVar11 = (int)uVar9 + iVar12, iVar12 < p->vCis->nSize - p->nRegs &&
                 (pGVar1 = Gia_ManCi(p,iVar12), pGVar1 != (Gia_Obj_t *)0x0))) {
            *(ulong *)pGVar1 =
                 *(ulong *)pGVar1 & 0xffffffffbfffffff |
                 (ulong)(((uint)(&pCex[1].iPo)[(int)uVar11 >> 5] >> ((byte)uVar11 & 0x1f) & 1) <<
                        0x1e);
            iVar12 = iVar12 + 1;
          }
          iVar12 = 0;
          while ((iVar12 < p->nObjs && (pGVar1 = Gia_ManObj(p,iVar12), pGVar1 != (Gia_Obj_t *)0x0)))
          {
            uVar9 = *(ulong *)pGVar1;
            if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
              uVar15 = (uint)(uVar9 >> 0x20);
              *(ulong *)pGVar1 =
                   uVar9 & 0xffffffff3fffffff |
                   (ulong)(((uVar15 >> 0x1d ^
                            *(uint *)(pGVar1 + -(ulong)(uVar15 & 0x1fffffff)) >> 0x1e) &
                            ((uint)(uVar9 >> 0x1d) & 7 ^
                            *(uint *)(pGVar1 + -(uVar9 & 0x1fffffff)) >> 0x1e) & 1) << 0x1e);
            }
            iVar12 = iVar12 + 1;
          }
          iVar12 = 0;
          while ((iVar12 < p->vCos->nSize &&
                 (pGVar1 = Gia_ManCo(p,iVar12), pGVar1 != (Gia_Obj_t *)0x0))) {
            uVar15 = (uint)*(ulong *)pGVar1;
            *(ulong *)pGVar1 =
                 *(ulong *)pGVar1 & 0xffffffffbfffffff |
                 (ulong)((uVar15 * 2 ^ *(uint *)(pGVar1 + -(ulong)(uVar15 & 0x1fffffff))) &
                        0x40000000);
            iVar12 = iVar12 + 1;
          }
          iVar12 = 0;
          while (((iVar12 < p->nRegs &&
                  (pGVar1 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar12),
                  pGVar1 != (Gia_Obj_t *)0x0)) &&
                 (pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12),
                 pGVar3 != (Gia_Obj_t *)0x0))) {
            *(ulong *)pGVar3 =
                 *(ulong *)pGVar3 & 0xffffffffbfffffff |
                 (ulong)((uint)*(undefined8 *)pGVar1 & 0x40000000);
            iVar12 = iVar12 + 1;
          }
          uVar9 = (ulong)uVar11;
        }
        iVar12 = 0;
        while ((iVar10 = iVar7, iVar12 < p->nRegs &&
               (pGVar1 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12),
               pGVar1 != (Gia_Obj_t *)0x0))) {
          if (p_00->vCis->nSize - p_00->nRegs <= iVar12) {
            __assert_fail("v < Gia_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
          }
          pGVar3 = Gia_ManCi(p_00,iVar12);
          iVar10 = Gia_ObjId(p_00,(Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe));
          if (iVar10 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          uVar11 = Abc_LitNotCond(((uint)pGVar3 & 1) + iVar10 * 2,
                                  (uint)((*(uint *)pGVar1 >> 0x1e & 1) == 0));
          pGVar1->Value = uVar11;
          iVar12 = iVar12 + 1;
        }
        for (; iVar12 = (int)uVar9, iVar10 <= pCex->iFrame; iVar10 = iVar10 + 1) {
          v = 0;
          while ((uVar11 = iVar12 + v, v < p->vCis->nSize - p->nRegs &&
                 (pGVar1 = Gia_ManCi(p,v), pGVar1 != (Gia_Obj_t *)0x0))) {
            *(ulong *)pGVar1 =
                 *(ulong *)pGVar1 & 0xffffffffbfffffff |
                 (ulong)(((uint)(&pCex[1].iPo)[(int)uVar11 >> 5] >> ((byte)uVar11 & 0x1f) & 1) <<
                        0x1e);
            v = v + 1;
          }
          iVar17 = 0;
          while ((iVar17 < p->nObjs && (pGVar1 = Gia_ManObj(p,iVar17), pGVar1 != (Gia_Obj_t *)0x0)))
          {
            uVar9 = *(ulong *)pGVar1;
            uVar5 = uVar9 & 0x1fffffff;
            if (uVar5 != 0x1fffffff && -1 < (int)uVar9) {
              uVar13 = (uint)(uVar9 >> 0x1d) & 7 ^ *(uint *)(pGVar1 + -uVar5) >> 0x1e;
              uVar15 = (uint)(uVar9 >> 0x20);
              uVar8 = (ulong)(uVar15 & 0x1fffffff);
              uVar14 = *(uint *)(pGVar1 + -uVar8) >> 0x1e & 1;
              uVar15 = uVar15 >> 0x1d & 1;
              uVar16 = (uVar14 ^ uVar15) & uVar13;
              *(ulong *)pGVar1 = uVar9 & 0xffffffff3fffffff | (ulong)(uVar16 << 0x1e);
              if (uVar16 == 0) {
                if (((uVar13 & 1) == 0) && (uVar14 == uVar15)) {
                  uVar15 = Gia_ManHashOr(p_00,pGVar1[-uVar5].Value,pGVar1[-uVar8].Value);
                }
                else if ((uVar13 & 1) == 0) {
                  uVar15 = pGVar1[-uVar5].Value;
                }
                else {
                  if (uVar14 != uVar15) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                                  ,0x144,
                                  "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                                 );
                  }
                  uVar15 = pGVar1[-uVar8].Value;
                }
              }
              else {
                uVar15 = Gia_ManHashAnd(p_00,pGVar1[-uVar5].Value,pGVar1[-uVar8].Value);
              }
              pGVar1->Value = uVar15;
              if (uVar15 == 0) {
                __assert_fail("pObj->Value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                              ,0x145,
                              "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                             );
              }
            }
            iVar17 = iVar17 + 1;
          }
          iVar17 = 0;
          while ((iVar17 < p->vCos->nSize &&
                 (pGVar1 = Gia_ManCo(p,iVar17), pGVar1 != (Gia_Obj_t *)0x0))) {
            uVar15 = (uint)*(ulong *)pGVar1;
            uVar9 = (ulong)(uVar15 & 0x1fffffff);
            *(ulong *)pGVar1 =
                 *(ulong *)pGVar1 & 0xffffffffbfffffff |
                 (ulong)((uVar15 * 2 ^ *(uint *)(pGVar1 + -uVar9)) & 0x40000000);
            uVar15 = pGVar1[-uVar9].Value;
            pGVar1->Value = uVar15;
            iVar17 = iVar17 + 1;
            if (uVar15 == 0) {
              __assert_fail("pObj->Value > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                            ,0x14b,
                            "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                           );
            }
          }
          if (iVar10 == pCex->iFrame) {
            iVar12 = iVar12 + v;
            break;
          }
          iVar12 = 0;
          while (((iVar12 < p->nRegs &&
                  (pGVar1 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar12),
                  pGVar1 != (Gia_Obj_t *)0x0)) &&
                 (pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12),
                 pGVar3 != (Gia_Obj_t *)0x0))) {
            *(ulong *)pGVar3 =
                 *(ulong *)pGVar3 & 0xffffffffbfffffff |
                 (ulong)((uint)*(undefined8 *)pGVar1 & 0x40000000);
            pGVar3->Value = pGVar1->Value;
            iVar12 = iVar12 + 1;
          }
          uVar9 = (ulong)uVar11;
        }
        if (iVar12 != pCex->nBits) {
          __assert_fail("iBit == pCex->nBits",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexCut.c"
                        ,0x155,
                        "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                       );
        }
        pGVar1 = Gia_ManPo(p,pCex->iPo);
        Gia_ManAppendCo(p_00,pGVar1->Value);
        iVar7 = iVar7 + 1;
      } while( true );
    }
    pGVar1 = Gia_ManCi(p,(p->vCis->nSize - iVar12) + iVar7);
    if (pGVar1 == (Gia_Obj_t *)0x0) {
      iVar12 = p->nRegs;
      goto LAB_00454c99;
    }
    *(ulong *)pGVar1 =
         *(ulong *)pGVar1 & 0xffffffffbfffffff |
         (ulong)(((uint)(&pCex[1].iPo)[local_48 >> 5] >> ((byte)local_48 & 0x1f) & 1) << 0x1e);
    local_48 = (ulong)(iVar7 + 1);
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllFrames( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vInitEnd;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, i, k, iBitOld, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );
    vInitEnd = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObjRo, k )
        if ( pObjRo->fMark0 )
            Vec_BitWriteEntry( vInitEnd, k, 1 );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObjRo, k )
        Gia_ManAppendCi(pNew);
    Gia_ManHashStart( pNew );

    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;

    iBitOld = iBit;
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
    {
        // set up correct init state
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->fMark0 = Vec_BitEntry( vInitEnd, k );
        // simulate it for a few frames
        iBit = iBitOld;
        for ( i = iFrEnd; i < f; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
                pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                               (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
            Gia_ManForEachCo( p, pObj, k )
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
                pObjRo->fMark0 = pObjRi->fMark0;
        }
        // start creating values
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->Value = Abc_LitNotCond( Gia_Obj2Lit(pNew, Gia_ManPi(pNew, k)), !pObjRo->fMark0 );
        for ( i = f; i <= pCex->iFrame; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 && !fCompl1 )
                    pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 )
                    pObj->Value = Gia_ObjFanin0(pObj)->Value;
                else if ( !fCompl1 )
                    pObj->Value = Gia_ObjFanin1(pObj)->Value;
                else assert( 0 );
                assert( pObj->Value > 0 );
            }
            Gia_ManForEachCo( p, pObj, k )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
                assert( pObj->Value > 0 );
            } 
            if ( i == pCex->iFrame )
                break;
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            {
                pObjRo->fMark0 = pObjRi->fMark0;
                pObjRo->Value = pObjRi->Value;
            }
        }
        assert( iBit == pCex->nBits );
        // create PO
        Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    }
    Gia_ManHashStop( pNew );
    Vec_BitFree( vInitEnd );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}